

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vdpp2.c
# Opt level: O0

MPP_RET vdpp2_control(VdppCtx ictx,VdppCmd cmd,void *iparam)

{
  MPP_RET MVar1;
  vdpp_api_params *param;
  MPP_RET ret;
  vdpp2_api_ctx *ctx;
  void *iparam_local;
  VdppCmd cmd_local;
  VdppCtx ictx_local;
  
  param._4_4_ = MPP_OK;
  if (((iparam == (void *)0x0) && (cmd != VDPP_CMD_RUN_SYNC)) || (ictx == (VdppCtx)0x0)) {
    _mpp_log_l(2,"vdpp2","found NULL iparam %p cmd %d ctx %p\n","vdpp2_control",iparam,cmd,ictx);
    return MPP_ERR_NULL_PTR;
  }
  if (cmd == VDPP_CMD_SET_SRC) {
    set_addr((vdpp_addr *)((long)ictx + 0x50),(VdppImg *)iparam);
  }
  else if (cmd == VDPP_CMD_SET_DST) {
    set_addr((vdpp_addr *)((long)ictx + 0x5c),(VdppImg *)iparam);
  }
  else {
    if (((cmd != VDPP_CMD_SET_COM_CFG) && (cmd != VDPP_CMD_SET_DMSR_CFG)) &&
       (1 < cmd - VDPP_CMD_SET_ZME_COM_CFG)) {
      if (cmd == VDPP_CMD_RUN_SYNC) {
        MVar1 = vdpp2_start((vdpp2_api_ctx *)ictx);
        if (MVar1 == MPP_OK) {
          vdpp2_wait((vdpp2_api_ctx *)ictx);
          vdpp2_done((vdpp2_api_ctx *)ictx);
          return MPP_OK;
        }
        _mpp_log_l(2,"vdpp2","run vdpp failed\n","vdpp2_control");
        return MPP_NOK;
      }
      if (cmd != VDPP_CMD_SET_COM2_CFG) {
        if (cmd == VDPP_CMD_SET_DST_C) {
          set_addr((vdpp_addr *)((long)ictx + 0x68),(VdppImg *)iparam);
          return MPP_OK;
        }
        if (cmd == VDPP_CMD_SET_HIST_FD) {
          *(undefined4 *)((long)ictx + 0x74) = *iparam;
          return MPP_OK;
        }
        if (2 < cmd - VDPP_CMD_SET_ES) {
          return MPP_OK;
        }
      }
    }
    param._4_4_ = vdpp2_set_param((vdpp2_api_ctx *)ictx,(vdpp_api_content *)((long)iparam + 8),
                                  *iparam);
    if (param._4_4_ != MPP_OK) {
      _mpp_log_l(2,"vdpp2","set vdpp parameter failed, type %d\n","vdpp2_control",*iparam);
    }
  }
  return param._4_4_;
}

Assistant:

MPP_RET vdpp2_control(VdppCtx ictx, VdppCmd cmd, void *iparam)
{
    struct vdpp2_api_ctx *ctx = ictx;
    MPP_RET ret = MPP_OK;

    if ((NULL == iparam && VDPP_CMD_RUN_SYNC != cmd) ||
        (NULL == ictx)) {
        mpp_err_f("found NULL iparam %p cmd %d ctx %p\n", iparam, cmd, ictx);
        return MPP_ERR_NULL_PTR;
    }

    switch (cmd) {
    case VDPP_CMD_SET_COM_CFG:
    case VDPP_CMD_SET_DMSR_CFG:
    case VDPP_CMD_SET_ZME_COM_CFG:
    case VDPP_CMD_SET_ZME_COEFF_CFG:
    case VDPP_CMD_SET_COM2_CFG:
    case VDPP_CMD_SET_ES:
    case VDPP_CMD_SET_DCI_HIST:
    case VDPP_CMD_SET_SHARP: {
        struct vdpp_api_params *param = (struct vdpp_api_params *)iparam;

        ret = vdpp2_set_param(ctx, &param->param, param->ptype);
        if (ret) {
            mpp_err_f("set vdpp parameter failed, type %d\n", param->ptype);
        }
        break;
    }
    case VDPP_CMD_SET_SRC:
        set_addr(&ctx->params.src, (VdppImg *)iparam);
        break;
    case VDPP_CMD_SET_DST:
        set_addr(&ctx->params.dst, (VdppImg *)iparam);
        break;
    case VDPP_CMD_SET_DST_C:
        set_addr(&ctx->params.dst_c, (VdppImg *)iparam);
        break;
    case VDPP_CMD_SET_HIST_FD:
        ctx->params.hist = *(RK_S32 *)iparam;
        break;
    case VDPP_CMD_RUN_SYNC:
        ret = vdpp2_start(ctx);
        if (ret) {
            mpp_err_f("run vdpp failed\n");
            return MPP_NOK;
        }

        vdpp2_wait(ctx);
        vdpp2_done(ctx);
        break;
    default:
        ;
    }

    return ret;
}